

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O3

void __thiscall slang::ast::CoverpointSymbol::checkBins(CoverpointSymbol *this)

{
  Scope *this_00;
  Type *this_01;
  Type *pTVar1;
  Diagnostic *this_02;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::CoverageBinSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::CoverageBinSymbol>,_(std::ranges::subrange_kind)0>
  sVar2;
  
  this_01 = DeclaredType::getType(&this->declaredType);
  pTVar1 = this_01->canonical;
  if (pTVar1 == (Type *)0x0) {
    Type::resolveCanonical(this_01);
    pTVar1 = this_01->canonical;
  }
  if ((pTVar1->super_Symbol).kind == FloatingType) {
    this_00 = (this->super_Symbol).parentScope;
    if ((this->isImplicit == true) && ((this->super_Symbol).name._M_len != 0)) {
      this_02 = Scope::addDiag(this_00,(DiagCode)0xb70006,(this->super_Symbol).location);
      Diagnostic::operator<<(this_02,(this->super_Symbol).name);
      return;
    }
    sVar2 = Scope::membersOfType<slang::ast::CoverageBinSymbol>(&this->super_Scope);
    if ((sVar2._M_begin.current.current == sVar2._M_end.current.current) &&
       (0 < (int)(this_00->compilation->options).languageVersion)) {
      Scope::addDiag(this_00,(DiagCode)0xb50006,(this->super_Symbol).location);
      return;
    }
  }
  return;
}

Assistant:

void CoverpointSymbol::checkBins() const {
    if (getType().isFloating()) {
        auto scope = getParentScope();
        SLANG_ASSERT(scope);

        if (isImplicit && !name.empty()) {
            scope->addDiag(diag::RealCoverpointImplicit, location) << name;
        }
        else if (membersOfType<CoverageBinSymbol>().empty()) {
            if (scope->getCompilation().languageVersion() >= LanguageVersion::v1800_2023)
                scope->addDiag(diag::RealCoverpointBins, location);
        }
    }
}